

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O3

void picosha2::detail::hash256_block<unsigned_long*,unsigned_char*>
               (unsigned_long *message_digest,uchar *first,uchar *last)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  size_t i;
  long lVar15;
  ulong uVar16;
  word_t w [64];
  ulong auStack_2b0 [4];
  code *pcStack_290;
  int local_270 [14];
  ulong local_238 [9];
  int aiStack_1f0 [10];
  ulong auStack_1c8 [51];
  
  if (first + 0x40 == last) {
    lVar15 = 0;
    pcStack_290 = (code *)0x103960;
    memset(local_238,0,0x200);
    do {
      uVar5 = *(uint *)(first + lVar15 * 4);
      local_238[lVar15] =
           (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    lVar15 = 0x10;
    do {
      uVar7 = auStack_2b0[lVar15];
      uVar13 = local_238[lVar15 + -2];
      local_238[lVar15] =
           (ulong)((int)local_238[0] + local_270[lVar15 * 2] +
                   ((uint)(uVar13 >> 10) ^ ((uint)(uVar13 >> 0x13) | (int)uVar13 << 0xd) ^
                   ((uint)(uVar13 >> 0x11) | (int)uVar13 << 0xf)) +
                  ((uint)(uVar7 >> 3) ^ ((uint)(uVar7 >> 0x12) | (int)uVar7 << 0xe) ^
                  ((uint)(uVar7 >> 7) | (int)uVar7 << 0x19)));
      lVar15 = lVar15 + 1;
      local_238[0] = uVar7;
    } while (lVar15 != 0x40);
    lVar15 = 0;
    uVar2 = message_digest[1];
    uVar7 = message_digest[4];
    uVar4 = message_digest[2];
    uVar10 = *message_digest;
    uVar11 = message_digest[3];
    uVar13 = message_digest[7];
    uVar3 = message_digest[6];
    uVar6 = message_digest[5];
    do {
      uVar16 = uVar6;
      uVar14 = uVar3;
      uVar9 = uVar10;
      uVar8 = uVar4;
      uVar6 = uVar7;
      uVar4 = uVar2;
      uVar5 = (uint)uVar6;
      iVar12 = (int)uVar13 + ((uint)uVar16 & uVar5) + (~uVar5 & (uint)uVar14) +
               (((uint)(uVar6 >> 0x19) | uVar5 << 7) ^
               ((uint)(uVar6 >> 0xb) | uVar5 << 0x15) ^ ((uint)(uVar6 >> 6) | uVar5 << 0x1a)) +
               *(int *)((long)&add_constant + lVar15) + *(int *)((long)local_238 + lVar15);
      uVar5 = (uint)uVar9;
      uVar7 = (ulong)(uint)((int)uVar11 + iVar12);
      uVar10 = (unsigned_long)
               (((uint)uVar8 & (uint)uVar4 ^ ((uint)uVar8 ^ (uint)uVar4) & uVar5) +
                (((uint)(uVar9 >> 0x16) | uVar5 << 10) ^
                ((uint)(uVar9 >> 0xd) | uVar5 << 0x13) ^ ((uint)(uVar9 >> 2) | uVar5 << 0x1e)) +
               iVar12);
      lVar15 = lVar15 + 8;
      uVar2 = uVar9;
      uVar11 = uVar8;
      uVar13 = uVar14;
      uVar3 = uVar16;
    } while (lVar15 != 0x200);
    *message_digest = uVar10 + *message_digest;
    message_digest[1] = uVar9 + message_digest[1];
    message_digest[2] = uVar4 + message_digest[2];
    message_digest[3] = uVar8 + message_digest[3];
    message_digest[4] = uVar7 + message_digest[4];
    message_digest[5] = uVar6 + message_digest[5];
    message_digest[6] = uVar16 + message_digest[6];
    message_digest[7] = uVar14 + message_digest[7];
    lVar15 = 0;
    do {
      uVar2 = (message_digest + lVar15)[1];
      puVar1 = message_digest + lVar15;
      *(int *)puVar1 = (int)message_digest[lVar15];
      *(undefined4 *)((long)puVar1 + 4) = 0;
      *(int *)(puVar1 + 1) = (int)uVar2;
      *(undefined4 *)((long)puVar1 + 0xc) = 0;
      lVar15 = lVar15 + 2;
    } while (lVar15 != 8);
    return;
  }
  pcStack_290 = hash256_one_by_one::write_data_bit_length;
  __assert_fail("first + 64 == last",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/simontime[P]devicecert-validator/picosha2.h"
                ,0x5d,
                "void picosha2::detail::hash256_block(RaIter1, RaIter2, RaIter2) [RaIter1 = unsigned long *, RaIter2 = unsigned char *]"
               );
}

Assistant:

void hash256_block(RaIter1 message_digest, RaIter2 first, RaIter2 last) {
    assert(first + 64 == last);
    static_cast<void>(last);  // for avoiding unused-variable warning
    word_t w[64];
    std::fill(w, w + 64, 0);
    for (std::size_t i = 0; i < 16; ++i) {
        w[i] = (static_cast<word_t>(mask_8bit(*(first + i * 4))) << 24) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 1))) << 16) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 2))) << 8) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 3))));
    }
    for (std::size_t i = 16; i < 64; ++i) {
        w[i] = mask_32bit(ssig1(w[i - 2]) + w[i - 7] + ssig0(w[i - 15]) +
                          w[i - 16]);
    }

    word_t a = *message_digest;
    word_t b = *(message_digest + 1);
    word_t c = *(message_digest + 2);
    word_t d = *(message_digest + 3);
    word_t e = *(message_digest + 4);
    word_t f = *(message_digest + 5);
    word_t g = *(message_digest + 6);
    word_t h = *(message_digest + 7);

    for (std::size_t i = 0; i < 64; ++i) {
        word_t temp1 = h + bsig1(e) + ch(e, f, g) + add_constant[i] + w[i];
        word_t temp2 = bsig0(a) + maj(a, b, c);
        h = g;
        g = f;
        f = e;
        e = mask_32bit(d + temp1);
        d = c;
        c = b;
        b = a;
        a = mask_32bit(temp1 + temp2);
    }
    *message_digest += a;
    *(message_digest + 1) += b;
    *(message_digest + 2) += c;
    *(message_digest + 3) += d;
    *(message_digest + 4) += e;
    *(message_digest + 5) += f;
    *(message_digest + 6) += g;
    *(message_digest + 7) += h;
    for (std::size_t i = 0; i < 8; ++i) {
        *(message_digest + i) = mask_32bit(*(message_digest + i));
    }
}